

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.cpp
# Opt level: O0

Var __thiscall Js::StreamReader::ReadHostObject(StreamReader *this)

{
  int iVar1;
  ScriptContext *scriptContext_00;
  ThreadContext *pTVar2;
  undefined4 extraout_var;
  undefined1 local_60 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  ScriptContext *scriptContext;
  Var object;
  StreamReader *this_local;
  
  scriptContext_00 = ScriptContextHolder::GetScriptContext(&this->super_ScriptContextHolder);
  LeaveScriptObject<true,_true,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)
             &autoReentrancyHandler.m_savedReentrancySafeOrHandled,scriptContext_00,&this_local);
  pTVar2 = ScriptContext::GetThreadContext(scriptContext_00);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_60,pTVar2);
  iVar1 = (**this->m_stream->_vptr_HostReadStream)();
  if (scriptContext_00 != (ScriptContext *)0x0) {
    pTVar2 = ScriptContext::GetThreadContext(scriptContext_00);
    ThreadContext::DisposeOnLeaveScript(pTVar2);
  }
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_60);
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)
             &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  return (Var)CONCAT44(extraout_var,iVar1);
}

Assistant:

Var StreamReader::ReadHostObject()
    {
        Var object = nullptr;
        ScriptContext* scriptContext = GetScriptContext();
        BEGIN_LEAVE_SCRIPT(scriptContext)
        {
            object = m_stream->ReadHostObject();
        }
        END_LEAVE_SCRIPT(scriptContext);
        return object;
    }